

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SmallVector<unsigned_long,_8UL> * __thiscall
spirv_cross::SmallVector<unsigned_long,_8UL>::operator=
          (SmallVector<unsigned_long,_8UL> *this,SmallVector<unsigned_long,_8UL> *other)

{
  unsigned_long *puVar1;
  ulong uVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  size_t i;
  ulong uVar5;
  
  (this->super_VectorView<unsigned_long>).buffer_size = 0;
  puVar4 = (other->super_VectorView<unsigned_long>).ptr;
  if ((AlignedBuffer<unsigned_long,_8UL> *)puVar4 == &other->stack_storage) {
    reserve(this,(other->super_VectorView<unsigned_long>).buffer_size);
    puVar4 = (this->super_VectorView<unsigned_long>).ptr;
    puVar1 = (other->super_VectorView<unsigned_long>).ptr;
    for (uVar5 = 0; uVar2 = (other->super_VectorView<unsigned_long>).buffer_size, uVar5 < uVar2;
        uVar5 = uVar5 + 1) {
      puVar4[uVar5] = puVar1[uVar5];
    }
    (this->super_VectorView<unsigned_long>).buffer_size = uVar2;
    (other->super_VectorView<unsigned_long>).buffer_size = 0;
  }
  else {
    puVar1 = (this->super_VectorView<unsigned_long>).ptr;
    if ((AlignedBuffer<unsigned_long,_8UL> *)puVar1 != &this->stack_storage) {
      free(puVar1);
      puVar4 = (other->super_VectorView<unsigned_long>).ptr;
    }
    (this->super_VectorView<unsigned_long>).ptr = puVar4;
    sVar3 = other->buffer_capacity;
    (this->super_VectorView<unsigned_long>).buffer_size =
         (other->super_VectorView<unsigned_long>).buffer_size;
    this->buffer_capacity = sVar3;
    (other->super_VectorView<unsigned_long>).ptr = (unsigned_long *)0x0;
    (other->super_VectorView<unsigned_long>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}